

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O3

Result __thiscall
spectest::JSONParser::ParseExpectedValue
          (JSONParser *this,ExpectedValue *out_value,AllowExpected allow_expected)

{
  ValueType VVar1;
  Type type_00;
  Result RVar2;
  int iVar3;
  undefined4 extraout_var;
  Enum EVar4;
  int lane;
  uint lane_00;
  string_view value_str_00;
  string_view value_str_01;
  Type type;
  string value_str;
  Type lane_type;
  Type local_78;
  uint local_6c;
  Type local_68;
  string local_60;
  undefined8 local_40;
  Type local_38;
  
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  RVar2 = Expect(this,"{");
  EVar4 = Error;
  if (RVar2.enum_ != Error) {
    RVar2 = ExpectKey(this,"type");
    if (RVar2.enum_ != Error) {
      RVar2 = ParseType(this,&local_78);
      if (RVar2.enum_ != Error) {
        RVar2 = Expect(this,",");
        if (RVar2.enum_ != Error) {
          if (local_78.enum_ == V128) {
            RVar2 = ExpectKey(this,"lane_type");
            if (RVar2.enum_ == Error) goto LAB_00121b44;
            RVar2 = ParseType(this,&local_38);
            if (RVar2.enum_ == Error) goto LAB_00121b44;
            RVar2 = Expect(this,",");
            if (RVar2.enum_ == Error) goto LAB_00121b44;
            RVar2 = ExpectKey(this,"value");
            if (RVar2.enum_ == Error) goto LAB_00121b44;
            RVar2 = Expect(this,"[");
            if (RVar2.enum_ == Error) goto LAB_00121b44;
            local_68 = local_38;
            iVar3 = LaneCountFromType(local_38);
            local_40 = CONCAT44(extraout_var,iVar3);
            local_6c = iVar3 - 1;
            lane_00 = 0;
            do {
              RVar2 = ParseString(this,&local_60);
              if (RVar2.enum_ == Error) goto LAB_00121b44;
              value_str_00._M_str = local_60._M_dataplus._M_p;
              value_str_00._M_len = local_60._M_string_length;
              RVar2 = ParseLaneConstValue(this,local_68,lane_00,out_value,value_str_00,
                                          allow_expected);
              if (RVar2.enum_ == Error) goto LAB_00121b44;
              if (lane_00 < local_6c) {
                RVar2 = Expect(this,",");
                if (RVar2.enum_ == Error) goto LAB_00121b44;
              }
              lane_00 = lane_00 + 1;
            } while ((uint)local_40 != lane_00);
            RVar2 = Expect(this,"]");
            if (RVar2.enum_ == Error) goto LAB_00121b44;
            VVar1.type_index_ = local_78.type_index_;
            VVar1.enum_ = local_78.enum_;
            (out_value->value).type = VVar1;
            out_value->lane_type = local_68;
          }
          else {
            RVar2 = ParseKeyStringValue(this,"value",&local_60);
            if (RVar2.enum_ == Error) goto LAB_00121b44;
            type_00.type_index_ = local_78.type_index_;
            type_00.enum_ = local_78.enum_;
            value_str_01._M_str = local_60._M_dataplus._M_p;
            value_str_01._M_len = local_60._M_string_length;
            RVar2 = ParseConstValue(this,type_00,&(out_value->value).value,out_value->nan,
                                    value_str_01,allow_expected);
            if (RVar2.enum_ == Error) goto LAB_00121b44;
            (out_value->value).type.enum_ = local_78.enum_;
            (out_value->value).type.type_index_ = local_78.type_index_;
          }
          RVar2 = Expect(this,"}");
          EVar4 = (Enum)(RVar2.enum_ == Error);
        }
      }
    }
  }
LAB_00121b44:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  return (Result)EVar4;
}

Assistant:

wabt::Result JSONParser::ParseExpectedValue(ExpectedValue* out_value,
                                            AllowExpected allow_expected) {
  Type type;
  std::string value_str;
  EXPECT("{");
  EXPECT_KEY("type");
  CHECK_RESULT(ParseType(&type));
  EXPECT(",");
  if (type == Type::V128) {
    Type lane_type;
    EXPECT_KEY("lane_type");
    CHECK_RESULT(ParseType(&lane_type));
    EXPECT(",");
    EXPECT_KEY("value");
    EXPECT("[");

    int lane_count = LaneCountFromType(lane_type);
    for (int lane = 0; lane < lane_count; ++lane) {
      CHECK_RESULT(ParseString(&value_str));
      CHECK_RESULT(ParseLaneConstValue(lane_type, lane, out_value, value_str,
                                       allow_expected));
      if (lane < lane_count - 1) {
        EXPECT(",");
      }
    }
    EXPECT("]");
    out_value->value.type = type;
    out_value->lane_type = lane_type;
  } else {
    PARSE_KEY_STRING_VALUE("value", &value_str);
    CHECK_RESULT(ParseConstValue(type, &out_value->value.value,
                                 &out_value->nan[0], value_str,
                                 allow_expected));
    out_value->value.type = type;
  }
  EXPECT("}");

  return wabt::Result::Ok;
}